

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O3

BOOL __thiscall LASinterval::get_cell(LASinterval *this,I32 c_index)

{
  U32 UVar1;
  iterator iVar2;
  LASintervalCell *pLVar3;
  I32 local_c;
  
  local_c = c_index;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this->cells,&local_c);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    pLVar3 = (LASintervalCell *)0x0;
  }
  else {
    this->index = *(I32 *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                                 ._M_cur + 8);
    pLVar3 = *(LASintervalCell **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>.
                     _M_cur + 0x10);
    UVar1 = pLVar3[1].end;
    this->full = pLVar3[1].start;
    this->total = UVar1;
  }
  this->current_cell = pLVar3;
  return iVar2.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur
         != (__node_type *)0x0;
}

Assistant:

BOOL LASinterval::get_cell(const I32 c_index)
{
  my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->find(c_index);
  if (hash_element == ((my_cell_hash*)cells)->end())
  {
    current_cell = 0;
    return FALSE;
  }
  index = (*hash_element).first;
  full = (*hash_element).second->full;
  total = (*hash_element).second->total;
  current_cell = (*hash_element).second;
  return TRUE;
}